

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

SourceBuffer * __thiscall
slang::SourceManager::assignText
          (SourceBuffer *__return_storage_ptr__,SourceManager *this,string_view path,
          string_view text,SourceLocation includedFrom)

{
  string_view pathStr;
  bool bVar1;
  __int_type __val;
  const_iterator __first;
  const_iterator __last;
  reference pvVar2;
  undefined1 auVar3 [16];
  value_type_conflict1 local_149;
  char *local_148;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_140;
  const_iterator local_138;
  undefined1 local_130 [8];
  vector<char,_std::allocator<char>_> buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [8];
  string temp;
  SourceManager *this_local;
  SourceLocation includedFrom_local;
  string_view text_local;
  string_view path_local;
  
  text_local._M_len = (size_t)text._M_str;
  includedFrom_local = (SourceLocation)text._M_len;
  text_local._M_str = (char *)path._M_len;
  temp.field_2._8_8_ = this;
  std::__cxx11::string::string(local_58);
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&text_local._M_str);
  auVar3._8_8_ = path._M_str;
  auVar3._0_8_ = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
  if (bVar1) {
    s_abi_cxx11_(&local_b8,"<unnamed_buffer",0xf);
    __val = std::__atomic_base<unsigned_int>::operator++
                      (&(this->unnamedBufferCount).super___atomic_base<unsigned_int>,0);
    std::__cxx11::to_string(&local_e8,__val);
    std::operator+(&local_98,&local_b8,&local_e8);
    s_abi_cxx11_(&local_108,">",1);
    std::operator+(&local_78,&local_98,&local_108);
    std::__cxx11::string::operator=(local_58,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_b8);
    auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view(local_58);
    text_local._M_str = auVar3._0_8_;
  }
  path_local._M_len = auVar3._8_8_;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = auVar3._0_8_;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_130)
  ;
  local_140._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::end
                         ((vector<char,_std::allocator<char>_> *)local_130);
  __gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>::
  __normal_iterator<char*>
            ((__normal_iterator<char_const*,std::vector<char,std::allocator<char>>> *)&local_138,
             &local_140);
  __first = std::basic_string_view<char,_std::char_traits<char>_>::begin
                      ((basic_string_view<char,_std::char_traits<char>_> *)&includedFrom_local);
  __last = std::basic_string_view<char,_std::char_traits<char>_>::end
                     ((basic_string_view<char,_std::char_traits<char>_> *)&includedFrom_local);
  local_148 = (char *)std::vector<char,std::allocator<char>>::insert<char_const*,void>
                                ((vector<char,std::allocator<char>> *)local_130,local_138,__first,
                                 __last);
  bVar1 = std::vector<char,_std::allocator<char>_>::empty
                    ((vector<char,_std::allocator<char>_> *)local_130);
  if ((bVar1) ||
     (pvVar2 = std::vector<char,_std::allocator<char>_>::back
                         ((vector<char,_std::allocator<char>_> *)local_130), *pvVar2 != '\0')) {
    local_149 = '\0';
    std::vector<char,_std::allocator<char>_>::push_back
              ((vector<char,_std::allocator<char>_> *)local_130,&local_149);
  }
  pathStr._M_str = (char *)path_local._M_len;
  pathStr._M_len = (size_t)text_local._M_str;
  assignBuffer(__return_storage_ptr__,this,pathStr,(vector<char,_std::allocator<char>_> *)local_130,
               includedFrom);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)local_130);
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

SourceBuffer SourceManager::assignText(string_view path, string_view text,
                                       SourceLocation includedFrom) {
    std::string temp;
    if (path.empty()) {
        using namespace std::literals;
        temp = "<unnamed_buffer"s + std::to_string(unnamedBufferCount++) + ">"s;
        path = temp;
    }

    std::vector<char> buffer;
    buffer.insert(buffer.end(), text.begin(), text.end());
    if (buffer.empty() || buffer.back() != '\0')
        buffer.push_back('\0');

    return assignBuffer(path, std::move(buffer), includedFrom);
}